

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O0

void Abc_NtkPrintSharing(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void *pvVar2;
  uint local_54;
  int local_50;
  int Counter;
  int n;
  int m;
  int k;
  int i;
  Abc_Obj_t *pNode2;
  Abc_Obj_t *pNode1;
  Abc_Obj_t *pObj2;
  Abc_Obj_t *pObj1;
  Vec_Ptr_t *vNodes2;
  Vec_Ptr_t *vNodes1;
  Abc_Ntk_t *pNtk_local;
  
  vNodes1 = (Vec_Ptr_t *)pNtk;
  printf("Statistics about sharing of logic nodes among the CO pairs.\n");
  printf("(CO1,CO2)=NumShared : ");
  for (m = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)vNodes1), m < iVar1; m = m + 1) {
    pObj2 = Abc_NtkCo((Abc_Ntk_t *)vNodes1,m);
    vNodes2 = Abc_NtkDfsNodes((Abc_Ntk_t *)vNodes1,&pObj2,1);
    for (Counter = 0; iVar1 = Vec_PtrSize(vNodes2), Counter < iVar1; Counter = Counter + 1) {
      pvVar2 = Vec_PtrEntry(vNodes2,Counter);
      *(uint *)((long)pvVar2 + 0x14) = *(uint *)((long)pvVar2 + 0x14) & 0xffffffef | 0x10;
    }
    for (n = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)vNodes1), n < iVar1; n = n + 1) {
      pNode1 = Abc_NtkCo((Abc_Ntk_t *)vNodes1,n);
      if (m < n) {
        pObj1 = (Abc_Obj_t *)Abc_NtkDfsNodes((Abc_Ntk_t *)vNodes1,&pNode1,1);
        local_54 = 0;
        for (local_50 = 0; iVar1 = Vec_PtrSize((Vec_Ptr_t *)pObj1), local_50 < iVar1;
            local_50 = local_50 + 1) {
          pvVar2 = Vec_PtrEntry((Vec_Ptr_t *)pObj1,local_50);
          local_54 = (*(uint *)((long)pvVar2 + 0x14) >> 4 & 1) + local_54;
        }
        printf("(%d,%d)=%d ",(ulong)(uint)m,(ulong)(uint)n,(ulong)local_54);
        Vec_PtrFree((Vec_Ptr_t *)pObj1);
      }
    }
    for (Counter = 0; iVar1 = Vec_PtrSize(vNodes2), Counter < iVar1; Counter = Counter + 1) {
      pvVar2 = Vec_PtrEntry(vNodes2,Counter);
      *(uint *)((long)pvVar2 + 0x14) = *(uint *)((long)pvVar2 + 0x14) & 0xffffffef;
    }
    Vec_PtrFree(vNodes2);
  }
  printf("\n");
  return;
}

Assistant:

void Abc_NtkPrintSharing( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes1, * vNodes2;
    Abc_Obj_t * pObj1, * pObj2, * pNode1, * pNode2;
    int i, k, m, n, Counter;

    // print the template
    printf( "Statistics about sharing of logic nodes among the CO pairs.\n" );
    printf( "(CO1,CO2)=NumShared : " );
    // go though the CO pairs
    Abc_NtkForEachCo( pNtk, pObj1, i )
    {
        vNodes1 = Abc_NtkDfsNodes( pNtk, &pObj1, 1 );
        // mark the nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode1, m )
            pNode1->fMarkA = 1;
        // go through the second COs
        Abc_NtkForEachCo( pNtk, pObj2, k )
        {
            if ( i >= k )
                continue;
            vNodes2 = Abc_NtkDfsNodes( pNtk, &pObj2, 1 );
            // count the number of marked
            Counter = 0;
            Vec_PtrForEachEntry( Abc_Obj_t *, vNodes2, pNode2, n )
                Counter += pNode2->fMarkA;
            // print
            printf( "(%d,%d)=%d ", i, k, Counter );
            Vec_PtrFree( vNodes2 );
        }
        // unmark the nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes1, pNode1, m )
            pNode1->fMarkA = 0;
        Vec_PtrFree( vNodes1 );
    }
    printf( "\n" );
}